

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_paramSwitch_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  ZSTD_strategy ZVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t bytes;
  U32 *pUVar7;
  void *pvVar8;
  BYTE *pBVar9;
  uint *puVar10;
  ZSTD_match_t *pZVar11;
  ZSTD_optimal_t *pZVar12;
  byte bVar13;
  U32 UVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  void *__s;
  size_t sVar18;
  uint uVar19;
  BYTE *__s_00;
  
  iVar6 = ZSTD_allocateChainTable
                    (cParams->strategy,useRowMatchFinder,
                     (uint)(forWho == ZSTD_resetTarget_CDict && ms->dedicatedDictSearch != 0));
  if (iVar6 == 0) {
    sVar18 = 0;
  }
  else {
    sVar18 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  bVar13 = (byte)cParams->hashLog;
  bytes = 1L << (bVar13 & 0x3f);
  uVar19 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (uVar19 = 0, cParams->minMatch == 3)) {
    uVar19 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar19 = cParams->windowLog;
    }
  }
  if (useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x79b,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  if (forceResetIndex == ZSTDirp_reset) {
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    (ms->window).base = " ";
    (ms->window).dictBase = " ";
    (ms->window).dictLimit = 2;
    (ms->window).lowLimit = 2;
    (ms->window).nextSrc = (BYTE *)".dyndep-";
    if (ws->tableValidEnd < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x222,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if (ws->allocStart < ws->tableValidEnd) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x223,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
  }
  ms->hashLog3 = uVar19;
  ms->lazySkipping = 0;
  UVar14 = *(int *)&(ms->window).nextSrc - *(int *)&(ms->window).base;
  (ms->window).lowLimit = UVar14;
  (ms->window).dictLimit = UVar14;
  ms->nextToUpdate = UVar14;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  if (ws->allocFailed != '\0') {
    __assert_fail("!ZSTD_cwksp_reserve_failed(ws)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x7a6,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  ws->tableEnd = ws->objectEnd;
  ZSTD_cwksp_assert_internal_consistency(ws);
  pUVar7 = (U32 *)ZSTD_cwksp_reserve_table(ws,4L << (bVar13 & 0x3f));
  ms->hashTable = pUVar7;
  pUVar7 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar18);
  ms->chainTable = pUVar7;
  sVar18 = 4L << ((byte)uVar19 & 0x3f);
  if (uVar19 == 0) {
    sVar18 = 0;
  }
  pUVar7 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar18);
  ms->hashTable3 = pUVar7;
  if (ws->allocFailed != '\0') {
    return 0xffffffffffffffc0;
  }
  if (crp != ZSTDcrp_leaveDirty) {
    pvVar8 = ws->objectEnd;
    __s = ws->tableValidEnd;
    if (__s < pvVar8) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x237,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
    }
    if (ws->allocStart < __s) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x238,"void ZSTD_cwksp_clean_tables(ZSTD_cwksp *)");
    }
    if (__s < ws->tableEnd) {
      memset(__s,0,(long)ws->tableEnd - (long)__s);
      pvVar8 = ws->objectEnd;
      __s = ws->tableValidEnd;
    }
    if (__s < pvVar8) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22a,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (ws->allocStart < __s) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22b,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (__s < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
  }
  if ((useRowMatchFinder != ZSTD_ps_enable) || (cParams->strategy - ZSTD_btlazy2 < 0xfffffffd))
  goto LAB_006b7b0e;
  if (forWho == ZSTD_resetTarget_CCtx) {
    if (ZSTD_cwksp_alloc_aligned_init_once < ws->phase) {
      __assert_fail("phase >= ws->phase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x13b,
                    "size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)"
                   );
    }
    uVar17 = bytes + 0x3f & 0xffffffffffffffc0;
    if (ws->phase == ZSTD_cwksp_alloc_objects) {
      pvVar8 = ws->objectEnd;
      ws->tableValidEnd = pvVar8;
      ws->initOnceStart = (void *)((ulong)ws->workspaceEnd & 0xffffffffffffffc0);
      uVar16 = (ulong)(-(int)pvVar8 & 0x3f);
      pvVar8 = (void *)((long)pvVar8 + uVar16);
      if (pvVar8 <= ws->workspaceEnd) {
        ws->objectEnd = pvVar8;
        ws->tableEnd = pvVar8;
        if (uVar16 != 0) {
          ws->tableValidEnd = pvVar8;
        }
        ws->phase = ZSTD_cwksp_alloc_aligned_init_once;
        ZSTD_cwksp_assert_internal_consistency(ws);
        goto LAB_006b79df;
      }
LAB_006b7a39:
      __s_00 = (BYTE *)0x0;
    }
    else {
LAB_006b79df:
      if (uVar17 == 0) goto LAB_006b7a39;
      __s_00 = (BYTE *)((long)ws->allocStart - uVar17);
      pBVar9 = (BYTE *)ws->tableEnd;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (__s_00 < pBVar9) {
        __assert_fail("alloc >= bottom",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                      ,0x124,
                      "void *ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *, const size_t)");
      }
      if (__s_00 < ws->tableValidEnd) {
        ws->tableValidEnd = __s_00;
      }
      ws->allocStart = __s_00;
    }
    if (((ulong)__s_00 & 0x3f) != 0) {
      __assert_fail("((size_t)ptr & (ZSTD_CWKSP_ALIGNMENT_BYTES-1))== 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x196,"void *ZSTD_cwksp_reserve_aligned_init_once(ZSTD_cwksp *, size_t)");
    }
    if ((__s_00 != (BYTE *)0x0) && (__s_00 < ws->initOnceStart)) {
      uVar16 = (long)ws->initOnceStart - (long)__s_00;
      if (uVar17 <= uVar16) {
        uVar16 = uVar17;
      }
      memset(__s_00,0,uVar16);
      ws->initOnceStart = __s_00;
    }
    ms->tagTable = __s_00;
    uVar17 = ms->hashSalt;
    uVar17 = ((uVar17 << 0x28 | uVar17 >> 0x18) ^ (uVar17 << 0xf | uVar17 >> 0x31) ^ uVar17) *
             -0x604de39ae16720db;
    uVar16 = (ulong)ms->hashSaltEntropy;
    uVar16 = ((uVar16 << 0x28 | (ulong)(ms->hashSaltEntropy >> 0x18)) ^ uVar16 << 0xf ^ uVar16) *
             -0x604de39ae16720db;
    uVar17 = ((uVar16 >> 0x23) + 4 ^ uVar16) * -0x604de39ae16720db ^
             ((uVar17 >> 0x23) + 8 ^ uVar17) * -0x604de39ae16720db;
    ms->hashSalt = uVar17 >> 0x1c ^ uVar17;
  }
  else {
    pBVar9 = (BYTE *)ZSTD_cwksp_reserve_aligned(ws,bytes);
    ms->tagTable = pBVar9;
    memset(pBVar9,0,bytes);
    ms->hashSalt = 0;
  }
  uVar19 = 6;
  if (cParams->searchLog < 6) {
    uVar19 = cParams->searchLog;
  }
  uVar15 = 4;
  if (4 < uVar19) {
    uVar15 = uVar19;
  }
  if (cParams->hashLog < uVar15) {
    __assert_fail("cParams->hashLog >= rowLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x7c8,
                  "size_t ZSTD_reset_matchState(ZSTD_matchState_t *, ZSTD_cwksp *, const ZSTD_compressionParameters *, const ZSTD_paramSwitch_e, const ZSTD_compResetPolicy_e, const ZSTD_indexResetPolicy_e, const ZSTD_resetTarget_e)"
                 );
  }
  ms->rowHashLog = cParams->hashLog - uVar15;
LAB_006b7b0e:
  if ((forWho == ZSTD_resetTarget_CCtx) && (ZSTD_btlazy2 < cParams->strategy)) {
    puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x400);
    (ms->opt).litFreq = puVar10;
    puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x90);
    (ms->opt).litLengthFreq = puVar10;
    puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0xd4);
    (ms->opt).matchLengthFreq = puVar10;
    puVar10 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x80);
    (ms->opt).offCodeFreq = puVar10;
    pZVar11 = (ZSTD_match_t *)ZSTD_cwksp_reserve_aligned(ws,0x8008);
    (ms->opt).matchTable = pZVar11;
    pZVar12 = (ZSTD_optimal_t *)ZSTD_cwksp_reserve_aligned(ws,0x1c01c);
    (ms->opt).priceTable = pZVar12;
  }
  uVar2 = cParams->windowLog;
  uVar3 = cParams->chainLog;
  uVar4 = cParams->hashLog;
  uVar5 = cParams->searchLog;
  uVar19 = cParams->minMatch;
  uVar15 = cParams->targetLength;
  ZVar1 = cParams->strategy;
  (ms->cParams).searchLog = cParams->searchLog;
  (ms->cParams).minMatch = uVar19;
  (ms->cParams).targetLength = uVar15;
  (ms->cParams).strategy = ZVar1;
  (ms->cParams).windowLog = uVar2;
  (ms->cParams).chainLog = uVar3;
  (ms->cParams).hashLog = uVar4;
  (ms->cParams).searchLog = uVar5;
  return (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_paramSwitch_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_ps_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;
    ms->lazySkipping = 0;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        /* Row match finder needs an additional table of hashes ("tags") */
        size_t const tagTableSize = hSize;
        /* We want to generate a new salt in case we reset a Cctx, but we always want to use
         * 0 when we reset a Cdict */
        if(forWho == ZSTD_resetTarget_CCtx) {
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned_init_once(ws, tagTableSize);
            ZSTD_advanceHashSalt(ms);
        } else {
            /* When we are not salting we want to always memset the memory */
            ms->tagTable = (BYTE*) ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            ZSTD_memset(ms->tagTable, 0, tagTableSize);
            ms->hashSalt = 0;
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = BOUNDED(4, cParams->searchLog, 6);
            assert(cParams->hashLog >= rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}